

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderDNA.h
# Opt level: O2

Base * __thiscall
Assimp::Blender::Structure::_allocate<Assimp::Blender::Base>
          (Structure *this,shared_ptr<Assimp::Blender::Base> *out,size_t *s)

{
  Base *__p;
  __shared_ptr<Assimp::Blender::Base,_(__gnu_cxx::_Lock_policy)2> _Stack_28;
  
  __p = (Base *)operator_new(0x38);
  (__p->super_ElemBase).dna_type = (char *)0x0;
  (__p->super_ElemBase)._vptr_ElemBase = (_func_int **)&PTR__Base_0075d200;
  __p->prev = (Base *)0x0;
  (__p->next).super___shared_ptr<Assimp::Blender::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (__p->next).super___shared_ptr<Assimp::Blender::Base,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (__p->object).super___shared_ptr<Assimp::Blender::Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (__p->object).super___shared_ptr<Assimp::Blender::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  ::std::__shared_ptr<Assimp::Blender::Base,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<Assimp::Blender::Base,void>
            ((__shared_ptr<Assimp::Blender::Base,(__gnu_cxx::_Lock_policy)2> *)&_Stack_28,__p);
  ::std::__shared_ptr<Assimp::Blender::Base,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&out->super___shared_ptr<Assimp::Blender::Base,_(__gnu_cxx::_Lock_policy)2>,&_Stack_28)
  ;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_28._M_refcount);
  *s = 1;
  return (out->super___shared_ptr<Assimp::Blender::Base,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
}

Assistant:

T* _allocate(std::shared_ptr<T>& out, size_t& s) const {
        out = std::shared_ptr<T>(new T());
        s = 1;
        return out.get();
    }